

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void doCommand(FILE *outf,int method,atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,
              atomBins *bbins,pointSet *dots,float probeRad,float density,float spikelen,
              int countDots,int rawOutput,int conFlag,char *rawname,double scoreBias,int drawSpike,
              int sayGroup,char *groupLabel,int argc,char **argv,char *message)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *local_1c00;
  char *local_1bf0;
  char *local_1be0;
  char *local_1bd0;
  char *local_1bb0;
  char *local_1b80;
  char *local_1b70;
  char *local_1b60;
  char *local_1b40;
  char *local_1b10;
  char *local_1b00;
  char *local_1ae0;
  char *local_1ab0;
  char *local_1aa0;
  char *local_1a90;
  char *local_1a80;
  char *local_1a70;
  char *local_1a50;
  char *local_1a20;
  char *local_1a10;
  char *local_1a00;
  char *local_19f0;
  char *local_19e0;
  char *local_19c0;
  char *local_1990;
  bool local_1979;
  char local_1978 [8];
  char extrastr [32];
  int j;
  int usesMovingAtoms;
  int numSkinDots;
  int nsel;
  dotNode *rslts [114] [7];
  double scoreBias_local;
  float spikelen_local;
  float density_local;
  float probeRad_local;
  atomBins *bbins_local;
  atom *allMovingAtoms_local;
  atomBins *abins_local;
  atom *allMainAtoms_local;
  int method_local;
  FILE *outf_local;
  
  extrastr[0x18] = '\0';
  extrastr[0x19] = '\0';
  extrastr[0x1a] = '\0';
  extrastr[0x1b] = '\0';
  local_1979 = allMovingAtoms != (atom *)0x0 && bbins != (atomBins *)0x0;
  extrastr._28_4_ = ZEXT14(local_1979);
  _density_local = bbins;
  bbins_local = (atomBins *)allMovingAtoms;
  if (extrastr._28_4_ == 0) {
    bbins_local = (atomBins *)0x0;
    _density_local = (atomBins *)0x0;
  }
  rslts[0x71][6] = (dotNode *)scoreBias;
  initResults((dotNode *(*) [7])&numSkinDots);
  if (((countDots == 0) && (rawOutput != 0)) && (Verbose != 0)) {
    if (OldStyleU == 0) {
      if (conFlag == 0) {
        note(
            ">>name:pat:type:srcAtom:targAtom:min-gap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval"
            );
      }
      else {
        note(
            ">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval"
            );
      }
    }
    else if (conFlag == 0) {
      note(
          ">>name:pat:type:srcAtom:targAtom:min-gap:gap:kissEdge2BullsEye:dot2BE:dot2SC:spike:score:stype:ttype:x:y:z:sBval:tBval"
          );
    }
    else {
      note(
          ">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:kissEdge2BullsEye:dot2BE:dot2SC:spike:score:stype:ttype:x:y:z:sBval:tBval"
          );
    }
  }
  if (method == 3) {
    if ((Verbose != 0) && ((countDots == 0 || (rawOutput == 0)))) {
      note("SelfIntersect");
    }
    if (((modelSrc == 0) && (modelTarg == 0)) && (1 < modelCount)) {
      modelLimit = modelCount;
    }
    else {
      modelLimit = 1;
    }
    extrastr[0x18] = '\x01';
    extrastr[0x19] = '\0';
    extrastr[0x1a] = '\0';
    extrastr[0x1b] = '\0';
    for (; (int)extrastr._24_4_ <= modelLimit; extrastr._24_4_ = extrastr._24_4_ + 1) {
      if ((1 < modelLimit) && (modelToProcess = modelNumber[(int)extrastr._24_4_], Verbose != 0)) {
        fprintf(_stderr,"processing modelNumber== %d\n",
                (ulong)(uint)modelNumber[(int)extrastr._24_4_]);
      }
      if (1 < (int)extrastr._24_4_) {
        freeResults((dotNode *(*) [7])&numSkinDots);
        initResults((dotNode *(*) [7])&numSkinDots);
      }
      genDotIntersect(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,probeRad,spikelen,1
                      ,1,(dotNode *(*) [7])&numSkinDots);
      if (countDots == 0) {
        if (rawOutput == 0) {
          if (OutputFmtType == 1) {
            writeAltFmtO(outf,1,1,"self_dots",(dotNode *(*) [7])&numSkinDots,drawSpike);
          }
          else if (OutputFmtType == 2) {
            descrCommand(outf,"# software:","# command:",argc,argv);
            writeAltFmtXV(outf,1,1,"self_dots",(dotNode *(*) [7])&numSkinDots,drawSpike);
          }
          else if (OutputFmtType == 3) {
            countsummary(outf,"SelfIntersect",1,1);
          }
          else {
            if (ContactSUMMARY != 0) {
              countsummary(outf,"SelfIntersect",9,1);
            }
            descrCommand(outf,"@caption"," command:",argc,argv);
            if (sayGroup != 0) {
              if (modelLimit < 2) {
                if (groupLabel == (char *)0x0) {
                  local_1a00 = "dots";
                }
                else {
                  local_1a00 = groupLabel;
                }
                fprintf((FILE *)outf,"@group dominant {%s}\n",local_1a00);
              }
              else {
                if (groupLabel == (char *)0x0) {
                  local_19f0 = "dots";
                }
                else {
                  local_19f0 = groupLabel;
                }
                fprintf((FILE *)outf,"@group dominant {%s M%d} animate\n",local_19f0,
                        (ulong)(uint)extrastr._24_4_);
              }
            }
            if (groupLabel == (char *)0x0) {
              local_1a10 = "dots";
            }
            else {
              local_1a10 = groupLabel;
            }
            sprintf(local_1978,"%s",local_1a10);
            writeOutput(outf,"self dots",(dotNode *(*) [7])&numSkinDots,drawSpike,3,local_1978,
                        probeRad);
          }
        }
        else {
          if (groupLabel == (char *)0x0) {
            local_19e0 = "";
          }
          else {
            local_19e0 = groupLabel;
          }
          writeRaw(outf,"1->1",(dotNode *(*) [7])&numSkinDots,probeRad,local_19e0,density,conFlag);
        }
      }
      else {
        if (rawOutput == 0) {
          descrCommand(outf,"program:","command:",argc,argv);
        }
        iVar1 = enumDotSkin(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,1);
        if (rawOutput == 0) {
          if (groupLabel == (char *)0x0) {
            local_1990 = "dots";
          }
          else {
            local_1990 = groupLabel;
          }
          fprintf((FILE *)outf,"selection: self\nname: %s\n",local_1990);
          fprintf((FILE *)outf,
                  "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
                  (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
          fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
                  (double)BUMPweight,(double)HBweight);
        }
        if (extrastr._28_4_ == 0) {
          usesMovingAtoms = countSelected(allMainAtoms,1);
        }
        else {
          iVar2 = countSelected(allMainAtoms,1);
          iVar3 = countSelected((atom *)bbins_local,1);
          usesMovingAtoms = iVar2 + iVar3;
        }
        if (rawOutput == 0) {
          enumerate(outf,"self dots",(dotNode *(*) [7])&numSkinDots,probeRad,3,usesMovingAtoms,
                    drawSpike,0,iVar1,density);
        }
        else {
          if (groupLabel == (char *)0x0) {
            local_19c0 = "";
          }
          else {
            local_19c0 = groupLabel;
          }
          rawEnumerate(outf,"",(dotNode *(*) [7])&numSkinDots,3,usesMovingAtoms,drawSpike,0,iVar1,
                       density,local_19c0,rawname,(double)rslts[0x71][6]);
        }
      }
    }
  }
  else if (method == 1) {
    if ((Verbose != 0) && ((countDots == 0 || (rawOutput == 0)))) {
      note("IntersectOnce");
    }
    genDotIntersect(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,probeRad,spikelen,1,2
                    ,(dotNode *(*) [7])&numSkinDots);
    if (countDots == 0) {
      if (rawOutput == 0) {
        if (OutputFmtType == 1) {
          writeAltFmtO(outf,1,1,"once_dots",(dotNode *(*) [7])&numSkinDots,drawSpike);
        }
        else if (OutputFmtType == 2) {
          descrCommand(outf,"# software:","# command:",argc,argv);
          writeAltFmtXV(outf,1,1,"once_dots",(dotNode *(*) [7])&numSkinDots,drawSpike);
        }
        else if (OutputFmtType == 3) {
          countsummary(outf,"IntersectOnce",1,1);
        }
        else {
          if (ContactSUMMARY != 0) {
            countsummary(outf,"IntersectOnce",9,1);
          }
          descrCommand(outf,"@caption"," command:",argc,argv);
          if (sayGroup != 0) {
            if (groupLabel == (char *)0x0) {
              local_1a80 = "dots";
            }
            else {
              local_1a80 = groupLabel;
            }
            fprintf((FILE *)outf,"@group dominant {%s}\n",local_1a80);
          }
          if (groupLabel == (char *)0x0) {
            local_1a90 = "dots";
          }
          else {
            local_1a90 = groupLabel;
          }
          sprintf(local_1978,"%s",local_1a90);
          writeOutput(outf,"once dots",(dotNode *(*) [7])&numSkinDots,drawSpike,1,local_1978,
                      probeRad);
        }
      }
      else {
        if (groupLabel == (char *)0x0) {
          local_1a70 = "";
        }
        else {
          local_1a70 = groupLabel;
        }
        writeRaw(outf,"1->2",(dotNode *(*) [7])&numSkinDots,probeRad,local_1a70,density,conFlag);
      }
    }
    else {
      if (rawOutput == 0) {
        descrCommand(outf,"program:","command:",argc,argv);
      }
      iVar1 = enumDotSkin(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,1);
      if (rawOutput == 0) {
        if (groupLabel == (char *)0x0) {
          local_1a20 = "dots";
        }
        else {
          local_1a20 = groupLabel;
        }
        fprintf((FILE *)outf,"selection: once\nname: %s\n",local_1a20);
        fprintf((FILE *)outf,
                "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
                (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
        fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
                (double)BUMPweight,(double)HBweight);
      }
      if (extrastr._28_4_ == 0) {
        usesMovingAtoms = countSelected(allMainAtoms,1);
      }
      else {
        iVar2 = countSelected(allMainAtoms,1);
        iVar3 = countSelected((atom *)bbins_local,1);
        usesMovingAtoms = iVar2 + iVar3;
      }
      if (rawOutput == 0) {
        enumerate(outf,"once dots",(dotNode *(*) [7])&numSkinDots,probeRad,1,usesMovingAtoms,
                  drawSpike,0,iVar1,density);
      }
      else {
        if (groupLabel == (char *)0x0) {
          local_1a50 = "";
        }
        else {
          local_1a50 = groupLabel;
        }
        rawEnumerate(outf,"",(dotNode *(*) [7])&numSkinDots,1,usesMovingAtoms,drawSpike,0,iVar1,
                     density,local_1a50,rawname,(double)rslts[0x71][6]);
      }
    }
  }
  else if (method == 2) {
    if ((Verbose != 0) && ((countDots == 0 || (rawOutput == 0)))) {
      note("IntersectBothWays");
    }
    if (countDots == 0) {
      if ((rawOutput == 0) && (OutputFmtType != 1)) {
        if (OutputFmtType == 2) {
          descrCommand(outf,"# software:","# command:",argc,argv);
        }
        else {
          descrCommand(outf,"@caption"," command:",argc,argv);
          if (sayGroup != 0) {
            if (groupLabel == (char *)0x0) {
              local_1ab0 = "dots";
            }
            else {
              local_1ab0 = groupLabel;
            }
            fprintf((FILE *)outf,"@group {%s}\n",local_1ab0);
          }
        }
      }
    }
    else if (rawOutput == 0) {
      descrCommand(outf,"program:","command:",argc,argv);
      if (groupLabel == (char *)0x0) {
        local_1aa0 = "dots";
      }
      else {
        local_1aa0 = groupLabel;
      }
      fprintf((FILE *)outf,"selection: both\nname: %s\n",local_1aa0);
      fprintf((FILE *)outf,
              "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
              (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
      fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
              (double)BUMPweight,(double)HBweight);
    }
    genDotIntersect(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,probeRad,spikelen,1,2
                    ,(dotNode *(*) [7])&numSkinDots);
    if (countDots == 0) {
      if (rawOutput == 0) {
        if (OutputFmtType == 1) {
          writeAltFmtO(outf,1,(uint)((sayGroup != 0 ^ 0xffU) & 1),"1->2",
                       (dotNode *(*) [7])&numSkinDots,drawSpike);
        }
        else if (OutputFmtType == 2) {
          writeAltFmtXV(outf,1,(uint)((sayGroup != 0 ^ 0xffU) & 1),"1->2",
                        (dotNode *(*) [7])&numSkinDots,drawSpike);
        }
        else if (OutputFmtType == 3) {
          countsummary(outf,"IntersectBothWays 1->2",1,0);
        }
        else {
          if (groupLabel == (char *)0x0) {
            local_1b10 = "dots";
          }
          else {
            local_1b10 = groupLabel;
          }
          sprintf(local_1978,"%s",local_1b10);
          writeOutput(outf,"1->2",(dotNode *(*) [7])&numSkinDots,drawSpike,2,local_1978,probeRad);
          if (ContactSUMMARY != 0) {
            countsummary(outf,"IntersectBothWays 1->2",9,0);
          }
        }
      }
      else {
        if (groupLabel == (char *)0x0) {
          local_1b00 = "";
        }
        else {
          local_1b00 = groupLabel;
        }
        writeRaw(outf,"1->2",(dotNode *(*) [7])&numSkinDots,probeRad,local_1b00,density,conFlag);
      }
    }
    else {
      iVar1 = enumDotSkin(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,1);
      if (extrastr._28_4_ == 0) {
        usesMovingAtoms = countSelected(allMainAtoms,1);
      }
      else {
        iVar2 = countSelected(allMainAtoms,1);
        iVar3 = countSelected((atom *)bbins_local,1);
        usesMovingAtoms = iVar2 + iVar3;
      }
      if (rawOutput == 0) {
        enumerate(outf,"1->2",(dotNode *(*) [7])&numSkinDots,probeRad,2,usesMovingAtoms,drawSpike,0,
                  iVar1,density);
      }
      else {
        if (groupLabel == (char *)0x0) {
          local_1ae0 = "";
        }
        else {
          local_1ae0 = groupLabel;
        }
        rawEnumerate(outf,"1->2",(dotNode *(*) [7])&numSkinDots,2,usesMovingAtoms,drawSpike,0,iVar1,
                     density,local_1ae0,rawname,(double)rslts[0x71][6]);
      }
    }
    freeResults((dotNode *(*) [7])&numSkinDots);
    initResults((dotNode *(*) [7])&numSkinDots);
    genDotIntersect(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,probeRad,spikelen,2,1
                    ,(dotNode *(*) [7])&numSkinDots);
    if (countDots == 0) {
      if (rawOutput == 0) {
        if (OutputFmtType == 1) {
          writeAltFmtO(outf,(uint)((sayGroup != 0 ^ 0xffU) & 1),1,"2->1",
                       (dotNode *(*) [7])&numSkinDots,drawSpike);
        }
        else if (OutputFmtType == 2) {
          writeAltFmtXV(outf,(uint)((sayGroup != 0 ^ 0xffU) & 1),1,"2->1",
                        (dotNode *(*) [7])&numSkinDots,drawSpike);
        }
        else if (OutputFmtType == 3) {
          countsummary(outf,"IntersectBothWays 2->1",1,2);
        }
        else {
          if (groupLabel == (char *)0x0) {
            local_1b70 = "dots";
          }
          else {
            local_1b70 = groupLabel;
          }
          sprintf(local_1978,"%s",local_1b70);
          writeOutput(outf,"2->1",(dotNode *(*) [7])&numSkinDots,drawSpike,2,local_1978,probeRad);
          if (ContactSUMMARY != 0) {
            countsummary(outf,"IntersectBothWays 2->1",9,2);
          }
        }
      }
      else {
        if (groupLabel == (char *)0x0) {
          local_1b60 = "";
        }
        else {
          local_1b60 = groupLabel;
        }
        writeRaw(outf,"2->1",(dotNode *(*) [7])&numSkinDots,probeRad,local_1b60,density,conFlag);
      }
    }
    else {
      iVar1 = enumDotSkin(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,2);
      if (extrastr._28_4_ == 0) {
        usesMovingAtoms = countSelected(allMainAtoms,2);
      }
      else {
        iVar2 = countSelected(allMainAtoms,2);
        iVar3 = countSelected((atom *)bbins_local,2);
        usesMovingAtoms = iVar2 + iVar3;
      }
      if (rawOutput == 0) {
        enumerate(outf,"2->1",(dotNode *(*) [7])&numSkinDots,probeRad,2,usesMovingAtoms,drawSpike,0,
                  iVar1,density);
      }
      else {
        if (groupLabel == (char *)0x0) {
          local_1b40 = "";
        }
        else {
          local_1b40 = groupLabel;
        }
        rawEnumerate(outf,"2->1",(dotNode *(*) [7])&numSkinDots,2,usesMovingAtoms,drawSpike,0,iVar1,
                     density,local_1b40,rawname,(double)rslts[0x71][6]);
      }
    }
  }
  else if (method == 0) {
    if ((Verbose != 0) && ((countDots == 0 || (rawOutput == 0)))) {
      note("ExternalSurface");
    }
    genDotSurface(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,probeRad,spikelen,1,
                  (dotNode *(*) [7])&numSkinDots);
    if (countDots == 0) {
      if (rawOutput == 0) {
        if (OutputFmtType == 1) {
          writeAltFmtO(outf,1,1,"extern_dots",(dotNode *(*) [7])&numSkinDots,0);
        }
        else if (OutputFmtType == 2) {
          descrCommand(outf,"# software:","# command:",argc,argv);
          writeAltFmtXV(outf,1,1,"extern_dots",(dotNode *(*) [7])&numSkinDots,0);
        }
        else {
          descrCommand(outf,"@caption"," command:",argc,argv);
          if (sayGroup != 0) {
            if (groupLabel == (char *)0x0) {
              local_1be0 = "dots";
            }
            else {
              local_1be0 = groupLabel;
            }
            fprintf((FILE *)outf,"@group dominant {%s}\n",local_1be0);
          }
          if (groupLabel == (char *)0x0) {
            local_1bf0 = "dots";
          }
          else {
            local_1bf0 = groupLabel;
          }
          sprintf(local_1978,"%s",local_1bf0);
          writeOutput(outf,"extern dots",(dotNode *(*) [7])&numSkinDots,0,0,local_1978,probeRad);
        }
      }
      else {
        if (groupLabel == (char *)0x0) {
          local_1bd0 = "";
        }
        else {
          local_1bd0 = groupLabel;
        }
        writeRaw(outf,"1->none",(dotNode *(*) [7])&numSkinDots,probeRad,local_1bd0,density,conFlag);
      }
    }
    else {
      if (rawOutput == 0) {
        descrCommand(outf,"program:","command:",argc,argv);
      }
      iVar1 = enumDotSkin(allMainAtoms,abins,(atom *)bbins_local,_density_local,dots,1);
      if (rawOutput == 0) {
        if (groupLabel == (char *)0x0) {
          local_1b80 = "dots";
        }
        else {
          local_1b80 = groupLabel;
        }
        fprintf((FILE *)outf,"selection: external\nname: %s\n",local_1b80);
        fprintf((FILE *)outf,
                "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
                (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
      }
      if (extrastr._28_4_ == 0) {
        usesMovingAtoms = countSelected(allMainAtoms,1);
      }
      else {
        iVar2 = countSelected(allMainAtoms,1);
        iVar3 = countSelected((atom *)bbins_local,1);
        usesMovingAtoms = iVar2 + iVar3;
      }
      if (rawOutput == 0) {
        enumerate(outf,"extern dots",(dotNode *(*) [7])&numSkinDots,probeRad,0,usesMovingAtoms,0,1,
                  iVar1,density);
      }
      else {
        if (groupLabel == (char *)0x0) {
          local_1bb0 = "";
        }
        else {
          local_1bb0 = groupLabel;
        }
        rawEnumerate(outf,"",(dotNode *(*) [7])&numSkinDots,0,usesMovingAtoms,0,1,iVar1,density,
                     local_1bb0,rawname,(double)rslts[0x71][6]);
      }
    }
  }
  else if (method == 4) {
    if ((Verbose != 0) && (rawOutput == 0)) {
      note("dumpAtomInfo");
      descrCommand(outf,"program:","command:",argc,argv);
      if (groupLabel == (char *)0x0) {
        local_1c00 = "dots";
      }
      else {
        local_1c00 = groupLabel;
      }
      fprintf((FILE *)outf,"selection: self\nname: %s\n",local_1c00);
      fprintf((FILE *)outf,
              "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
              (double)density,(double)probeRad,(double)RadScaleFactor,(double)RadScaleOffset);
      fprintf((FILE *)outf,"score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",(double)GAPweight,
              (double)BUMPweight,(double)HBweight);
    }
    if (extrastr._28_4_ == 0) {
      usesMovingAtoms = countSelected(allMainAtoms,1);
    }
    else {
      iVar1 = countSelected(allMainAtoms,1);
      iVar2 = countSelected((atom *)bbins_local,1);
      usesMovingAtoms = iVar1 + iVar2;
    }
    if (rawOutput == 0) {
      fprintf((FILE *)outf,"atoms selected: %d\n",(ulong)(uint)usesMovingAtoms);
    }
    else if (groupLabel == (char *)0x0) {
      fprintf((FILE *)outf,"%d %s\n",(ulong)(uint)usesMovingAtoms,rawname);
    }
    else {
      fprintf((FILE *)outf,"%d %s %s%s\n",(ulong)(uint)usesMovingAtoms,rawname,"#",groupLabel);
    }
  }
  freeResults((dotNode *(*) [7])&numSkinDots);
  return;
}

Assistant:

void doCommand(FILE *outf, int method,
   atom *allMainAtoms, atomBins *abins,
   atom *allMovingAtoms, atomBins *bbins,
   pointSet dots[], float probeRad, float density, float spikelen,
   int countDots, int rawOutput, int conFlag, char* rawname, double scoreBias,
   int drawSpike, int sayGroup, char* groupLabel,
   int argc, char **argv, char message[])
{

/* NOTE: allMainAtoms/abins & allMovingAtoms/bbins must be disjoint */
/*       sets of atoms (none in common) or allMovingAtoms/bbins can */
/*       be NULL.                                                   */
/*       allMovingAtoms refers to autobondrot set of atoms          */

   /*doCommand is called from mainProbeProc() with rawname=="" */
   /* and called from movingDoCommand() with rawname==orientationName */
   /* which holds the string of the current autobondrot cycle's angle values*/
   /*for autobondrot: method is set by probe command, e.g. */
   /* INTERSECTONCE==1 as used in example of mobile sidechain in a protein */
   /* SELFINTERSECT==3 as used by alaphitaupsi ramachandran calculation*/
   /* autobondrot option defines: countDots==1, rawOutput==1*/
   /* autobondrot seems to get here with: drawSpike==1*/

   dotNode *rslts[NUMATOMTYPES][NODEWIDTH];
   int nsel = 0, numSkinDots = 0;
   int usesMovingAtoms = FALSE;

   int  j=0;

   char extrastr[32]; /*060129 for extra master to control orig vs fitted dots*/

   /*allMovingAtoms is closest thing to a flag for autobondrot mode*/
   /*so if it exists and bbins exist (dcr?: mobile atoms near enough?) */
   /*then usesMovingAtoms becomes the flag for autobondrot mode */
   /*in effect probe is modal but too object oriented to admit such globalness*/

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));
   if (! usesMovingAtoms)
   {
	allMovingAtoms = NULL;
	bbins = NULL;
   }

   initResults(rslts);
   if (!countDots && rawOutput && Verbose)
   { /*write rawOutput col headers*/
        if (OldStyleU)
        {
        	if(conFlag)
        		note(">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:"
        		"kissEdge2BullsEye:dot2BE:dot2SC:spike:score:"
        		"stype:ttype:x:y:z:sBval:tBval");
        	else
        		note(">>name:pat:type:srcAtom:targAtom:min-gap:gap:"
        		"kissEdge2BullsEye:dot2BE:dot2SC:spike:score:"
        		"stype:ttype:x:y:z:sBval:tBval");
       }
       else
       {
       	       if(conFlag)
       	      		 note(">>name:pat:type:srcAtom:targAtom:dot-count:min-gap:gap:"
       	       	       "spX:spY:spZ:spikeLen:score:"
              	       "stype:ttype:x:y:z:sBval:tBval");
              else
              	   note(">>name:pat:type:srcAtom:targAtom:min-gap:gap:"
       	       	       "spX:spY:spZ:spikeLen:score:"
              	       "stype:ttype:x:y:z:sBval:tBval");
       }
   }/*write rawOutput col headers*/
   if (method == SELFINTERSECT)
   {/*{{{(method == SELFINTERSECT)___expected default method___****/
   	   if (Verbose && !(countDots && rawOutput))
   		note("SelfIntersect");

    /*SELFINTERSECT case, using one input file (and where srcPat == targPat)*/
    /*is where unwashed NMR files with multiple models can be processed */
    /*when there is not a single model specified in the pattern.*/
    /*This uses a loop through all the model numbers actually in the file.*/

    	  if(modelSrc == 0 && modelTarg == 0 && modelCount > 1) /*041114*/ /*multiple models in file but no model specified in pattern*/
    	        modelLimit = modelCount;
          else
   		modelLimit = 1;

   	  for(j = 1; j <= modelLimit; j++) /*041114*/
   	  {/*loop over models*/

   	  	  if(modelLimit > 1)
   	  	  {/*defines the multiple model case*/
   	  	  	  modelToProcess = modelNumber[j]; /*models can be in any order 041114*/
   	  	  	  if(Verbose)
   	  	  	    	  fprintf(stderr,"processing modelNumber== %d\n",modelNumber[j]);
   	  	  }
   	  	  if(j > 1)
   	  	  {
   	  	  	  freeResults(rslts);
   	  	  	  initResults(rslts);
   	  	  }
   	  	  genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,dots, probeRad, spikelen,SET1, SET1, rslts);
   	  	  /*does this for all atoms... calls examineDots()*/

          
   	  	  if (countDots)
   	  	  {/*autobondrot sets this, commandline can set this*/
   	  	  	  if (!rawOutput) {descrCommand(outf, "program:", "command:", argc, argv);}
   	  	  	  numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
   	  	  	  /*numSkinDots used to normalize output score*/
   	  	  	  if (!rawOutput)
   	  	  	  {
   	  	  	  	  fprintf(outf, "selection: self\nname: %s\n", groupLabel?groupLabel:"dots");
   	  	  	  	  fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
   	  	  	  	  	  density, probeRad, RadScaleFactor, RadScaleOffset);
   	  	  	  	  fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
   	  	  	  	  	  GAPweight, BUMPweight, HBweight);
   	  	  	  }
   	  	  	  if (usesMovingAtoms)
   	  	  	    	  nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
   	  	  	  else
   	  	  	    	  nsel = countSelected(allMainAtoms, SET1);

   	  	  	  if (rawOutput)
   	  	  	  {/*autobondrot sets this*/
   	  	  	  	  rawEnumerate(outf, "", rslts, method,
   	  	  	  	  	  nsel, drawSpike, FALSE, numSkinDots, density,
   	  	  	  	  	  groupLabel?groupLabel:"", rawname, scoreBias);
   	  	  	  }
   	  	  	  else
   	  	  	  {
   	  	  	  	  enumerate(outf, "self dots", rslts, probeRad, method, nsel,
   	  	  	  	  	  drawSpike, FALSE, numSkinDots, density);
   	  	  	  }
   	  	  }/*countDots*/
   	  	  else
   	  	  {
   	  	  	  if (rawOutput)
				{
   	  	  	    	  writeRaw(outf, "1->1", rslts, probeRad,groupLabel?groupLabel:"", density,conFlag);
				}
   	  	  	  else if (OutputFmtType == 1)
   	  	  	   	  writeAltFmtO(outf, TRUE, TRUE, "self_dots", rslts, drawSpike);
   	  	  	  else if (OutputFmtType == 2)
   	  	  	  {
   	  	  	  	  descrCommand(outf, "# software:", "# command:", argc, argv);
   	  	  	  	  writeAltFmtXV(outf, TRUE, TRUE, "self_dots", rslts, drawSpike);
   	  	  	  }
   	  	  	  else if (OutputFmtType == 3)
   	  	  	  { /*dcr041101 ONELINE :count:summaries:*/
   	  	  	  	  countsummary(outf,"SelfIntersect", 1, 1); /*dcr041101 Lines,Pass*/
   	  	  	  }
   	  	  	  else
   	  	  	  {/*kinemage output*/
   	  	  	  	  if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
   	  	  	  	    	countsummary(outf,"SelfIntersect", 9, 1);

   	  	  	  	  descrCommand(outf, "@caption", " command:", argc, argv);

   	  	  	  	  if (sayGroup)
   	  	  	  	  {
   	  	  	  	  	  if(modelLimit > 1)
   	  	  	  	  	  {/*doing jth of multiple models of an ensemble*/
   	  	  	  	  	  	  fprintf(outf, "@group dominant {%s M%d} animate\n",groupLabel?groupLabel:"dots",j);
   	  	  	  	  	  }
   	  	  	  	  	  else
   	  	  	  	  	    	  fprintf(outf, "@group dominant {%s}\n",groupLabel?groupLabel:"dots");
   	  	  	  	  }
   	  	  	  	  sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
                  writeOutput(outf, "self dots", rslts, drawSpike, method, extrastr, probeRad);
                           /*add probeRad 20111220dcr*/
   	  	  	  }/*kinemage output*/
   	  	  }
   	  }/*loop over models*/
   }/*}}}(method == SELFINTERSECT)________________________________*/

   else if (method == INTERSECTONCE)
   {/*{{{(method == INTERSECTONCE)*********************************/
      if (Verbose && !(countDots && rawOutput))
      	      note("IntersectOnce");

      genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,dots, probeRad, spikelen, SET1, SET2, rslts);

      if (countDots)
      {/*autobondrot sets this*/
      	      if (!rawOutput)
      	      	      descrCommand(outf, "program:", "command:", argc, argv);

      	      numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
         /*numSkinDots used to normalize output score*/
              if (!rawOutput)
	      {
	 	     fprintf(outf, "selection: once\nname: %s\n", groupLabel?groupLabel:"dots");
	 	     fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
	 	     	     density, probeRad, RadScaleFactor, RadScaleOffset);
		     fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
		     	     GAPweight, BUMPweight, HBweight);
	      }
	      if (usesMovingAtoms)
	      	      nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
              else
              	      nsel = countSelected(allMainAtoms, SET1);

              if (rawOutput)
              {/*autobondrot sets this*/
              	      rawEnumerate(outf,"", rslts, method, nsel,
              	      	      drawSpike, FALSE, numSkinDots, density,
              	      	      groupLabel?groupLabel:"", rawname, scoreBias);
              }
              else
              {
              	      enumerate(outf,"once dots", rslts, probeRad, method, nsel,
              	      	      drawSpike, FALSE, numSkinDots, density);
              }
      }
      else
      {
      	      if (rawOutput)
		{
      	      	    writeRaw(outf, "1->2", rslts, probeRad,groupLabel?groupLabel:"", density,conFlag);

		}
		else if (OutputFmtType == 1)
	      	      writeAltFmtO(outf, TRUE, TRUE, "once_dots", rslts, drawSpike);
	      else if (OutputFmtType == 2)
	      {
	      	      descrCommand(outf, "# software:", "# command:", argc, argv);
	      	      writeAltFmtXV(outf, TRUE, TRUE, "once_dots", rslts, drawSpike);
	      }
	      else if (OutputFmtType == 3)
	      { /*dcr041101 ONELINE :count:summaries:*/
	      	      countsummary(outf,"IntersectOnce", 1, 1); /*dcr041101 Lines,Pass*/
	      }
	      else
	      {/*write kinemage*/
	      	      if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
               			countsummary(outf,"IntersectOnce", 9, 1);

               	      descrCommand(outf, "@caption", " command:", argc, argv);
               	      if (sayGroup)
               	      	      fprintf(outf, "@group dominant {%s}\n", groupLabel?groupLabel:"dots");

               	      sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
                         writeOutput(outf, "once dots", rslts, drawSpike, method, extrastr, probeRad);
                         /*add probeRad 20111220dcr*/
              }
      }
   }/*}}}(method == INTERSECTONCE)________________________________*/

   else if (method == INTERSECTBOTHWAYS)
   {/*{{{(method == INTERSECTBOTHWAYS)*****************************/
      if (Verbose && !(countDots && rawOutput))
      		note("IntersectBothWays");

      if (countDots)
      {
	 if (!rawOutput)
	 {
	    descrCommand(outf, "program:", "command:", argc, argv);
	    fprintf(outf, "selection: both\nname: %s\n", groupLabel?groupLabel:"dots");
	    fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
				 density, probeRad, RadScaleFactor, RadScaleOffset);
	    fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
				 GAPweight, BUMPweight, HBweight);
	 }
      }
      else
      {
      	      if (rawOutput) {}
		   /* do nothing on purpose */
	      else if (OutputFmtType == 1) {}
	      else if (OutputFmtType == 2)
	      	      descrCommand(outf, "# software:", "# command:", argc, argv);
	      else
	      {/*kinemage: keywords before double pass*/
	      	      descrCommand(outf, "@caption", " command:", argc, argv);
	      	      if (sayGroup)
	      	      		fprintf(outf, "@group {%s}\n",groupLabel?groupLabel:"dots");
	    }
      }

      genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,
		  dots, probeRad, spikelen, SET1, SET2, rslts);

      if (countDots)
      {
	 numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
         /*numSkinDots used to normalize output score*/
	 if (usesMovingAtoms)
	     nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
	 else
             nsel = countSelected(allMainAtoms, SET1);

	 if (rawOutput)
	 {
	    rawEnumerate(outf, "1->2", rslts, method, nsel,
			drawSpike, FALSE, numSkinDots, density,
			groupLabel?groupLabel:"", rawname, scoreBias);
	 }
	 else
	 {
	    enumerate(outf, "1->2", rslts, probeRad, method, nsel,
			drawSpike, FALSE, numSkinDots, density);
	 }
      }
      else
      {
	 if (rawOutput)
	{
	    writeRaw(outf, "1->2", rslts, probeRad, groupLabel?groupLabel:"", density,conFlag);

	}
	else if (OutputFmtType == 1)
	    writeAltFmtO(outf, TRUE, !sayGroup, "1->2", rslts, drawSpike);
	 else if (OutputFmtType == 2)
	    writeAltFmtXV(outf, TRUE, !sayGroup, "1->2", rslts, drawSpike);
	 else if (OutputFmtType == 3)
	 { /*dcr041101 ONELINE :count:summaries:*/
            countsummary(outf,"IntersectBothWays 1->2", 1, 0);
            /*dcr041101 Lines,Pass==0 no output for this pass*/
	 }
	 else
	 {
            sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
        writeOutput(outf, "1->2", rslts, drawSpike, method, extrastr,probeRad);
        /*add probeRad 20111220dcr*/

            if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
             	countsummary(outf,"IntersectBothWays 1->2", 9, 0);
               /*dcr041101 Lines,Pass==0 no output for this pass*/
	 }
      }
      freeResults(rslts);
      initResults(rslts);

      genDotIntersect(allMainAtoms, abins, allMovingAtoms, bbins,
			dots, probeRad, spikelen, SET2, SET1, rslts);

      if (countDots)
      {
	 numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET2);
         /*numSkinDots used to normalize output score*/
	 if (usesMovingAtoms)
	 	 nsel = countSelected(allMainAtoms,   SET2) + countSelected(allMovingAtoms, SET2);
	 else
	 	 nsel = countSelected(allMainAtoms, SET2);

	 if (rawOutput)
	 {
	    rawEnumerate(outf, "2->1", rslts, method, nsel,
			drawSpike, FALSE, numSkinDots, density,
			groupLabel?groupLabel:"", rawname, scoreBias);
	 }
	 else
	 {
	    enumerate(outf, "2->1", rslts, probeRad, method, nsel,
			drawSpike, FALSE, numSkinDots, density);
	 }
      }
      else
      {
	 if (rawOutput)
	 {
         writeRaw(outf, "2->1", rslts, probeRad,
			groupLabel?groupLabel:"", density,conFlag);

	 }
	 else if (OutputFmtType == 1)
	 {
	    writeAltFmtO(outf, !sayGroup, TRUE, "2->1", rslts, drawSpike);
	 }
	 else if (OutputFmtType == 2)
	 {
	    writeAltFmtXV(outf, !sayGroup, TRUE, "2->1", rslts, drawSpike);
	 }
	 else if (OutputFmtType == 3)
	 { /*dcr041101 ONELINE :count:summaries:*/
            countsummary(outf,"IntersectBothWays 2->1", 1, 2);
            /*dcr041101 Lines,Pass==2 output sum of 2 passes*/
	 }
	 else
	 {
            sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
        writeOutput(outf, "2->1", rslts, drawSpike, method, extrastr, probeRad);
        /*add probeRad 20111220dcr*/

            if(ContactSUMMARY) /*dcr041101 Lines,Pass*/
               countsummary(outf,"IntersectBothWays 2->1", 9, 2);
               /*dcr041101 Lines,Pass==2 output sum of 2 passes*/
	 }
      }
   }/*}}}(method == INTERSECTBOTHWAYS)____________________________*/

   else if (method == EXTERNALSURFACE)
   {/*{{{(method == EXTERNALSURFACE)*******************************/
      if (Verbose && !(countDots && rawOutput))
      	      note("ExternalSurface");

      genDotSurface(allMainAtoms, abins, allMovingAtoms, bbins, dots, probeRad, spikelen, SET1, rslts);

      if (countDots)
      {
	 if (!rawOutput)
	    descrCommand(outf, "program:", "command:", argc, argv);

	 numSkinDots = enumDotSkin(allMainAtoms, abins, allMovingAtoms, bbins, dots, SET1);
         /*numSkinDots used to normalize output score*/
	 if (!rawOutput)
	 {
	    fprintf(outf, "selection: external\nname: %s\n",groupLabel?groupLabel:"dots");
	    fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
		     density, probeRad, RadScaleFactor, RadScaleOffset);
	 }
	 if (usesMovingAtoms)
	 	 nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
	 else
	 	 nsel = countSelected(allMainAtoms, SET1);

	 if (rawOutput)
	 {
	    rawEnumerate(outf, "", rslts, method, nsel,
		     FALSE, TRUE, numSkinDots, density,
		     groupLabel?groupLabel:"", rawname, scoreBias);
	 }
	 else
	 {
	    enumerate(outf, "extern dots", rslts, probeRad, method, nsel,
		     FALSE, TRUE, numSkinDots, density);
	 }
      }
      else
      {
	 if (rawOutput)
	 {
	    writeRaw(outf, "1->none", rslts, probeRad,
		  groupLabel?groupLabel:"", density,conFlag);

	 }
	 else if (OutputFmtType == 1)
	 {
	    writeAltFmtO(outf, TRUE, TRUE, "extern_dots", rslts, FALSE);
	 }
	 else if (OutputFmtType == 2)
	 {
	    descrCommand(outf, "# software:", "# command:", argc, argv);
	    writeAltFmtXV(outf, TRUE, TRUE, "extern_dots", rslts, FALSE);
	 }
	 else
	 {
	    descrCommand(outf, "@caption", " command:", argc, argv);
	    if (sayGroup)
	       	fprintf(outf, "@group dominant {%s}\n", groupLabel?groupLabel:"dots");

            sprintf(extrastr,"%s",groupLabel?groupLabel:"dots"); /*060129*/
        writeOutput(outf, "extern dots", rslts, FALSE, method, extrastr, probeRad);
        /*add probeRad 20111220dcr*/
	 }
      }
   }/*}}}(method == EXTERNALSURFACE)______________________________*/

   else if (method == DUMPATOMCOUNT)
   {/*{{{(method == DUMPATOMCOUNT)*********************************/
      if (Verbose && !rawOutput)
      {
	 note("dumpAtomInfo");
	 descrCommand(outf, "program:", "command:", argc, argv);
	 fprintf(outf, "selection: self\nname: %s\n", groupLabel?groupLabel:"dots");
	 fprintf(outf, "density: %.1f dots per A^2\nprobeRad: %.3f A\nVDWrad: (r * %.3f) + %.3f A\n",
				 density, probeRad, RadScaleFactor, RadScaleOffset);
	 fprintf(outf, "score weights: gapWt=%g, bumpWt=%g, HBWt=%g\n",
				 GAPweight, BUMPweight, HBweight);
      }
      if (usesMovingAtoms)
	 nsel = countSelected(allMainAtoms,   SET1) + countSelected(allMovingAtoms, SET1);
      else
	 nsel = countSelected(allMainAtoms, SET1);

      if (rawOutput)
      {
	 if (groupLabel)
	 {
	    fprintf(outf, "%d %s %s%s\n", nsel, rawname,
	       RAW_HEADER_COMMENT, groupLabel);
	 }
	 else
	 {
	    fprintf(outf, "%d %s\n", nsel, rawname);
	 }
      }
      else
      {
	 fprintf(outf, "atoms selected: %d\n", nsel);
      }
   }/*}}}(method == DUMPATOMCOUNT)_______________________________*/

   freeResults(rslts);

}